

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O0

void __thiscall
FunctionTable::InsertTerm
          (FunctionTable *this,string *func_name,int space_length,int return_value_number,
          vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type)

{
  size_type sVar1;
  string local_d8;
  undefined1 local_b8 [8];
  FunctionTableTerm term;
  int argument_number;
  vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type_local;
  int return_value_number_local;
  int space_length_local;
  string *func_name_local;
  FunctionTable *this_local;
  
  sVar1 = std::vector<_SymbolType,_std::allocator<_SymbolType>_>::size(argument_type);
  term.m_argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar1;
  std::__cxx11::string::string((string *)&local_d8,(string *)func_name);
  FunctionTableTerm::FunctionTableTerm
            ((FunctionTableTerm *)local_b8,&local_d8,space_length,
             term.m_argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,return_value_number,
             argument_type);
  std::__cxx11::string::~string((string *)&local_d8);
  std::vector<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>::push_back
            (&this->m_func_table,(value_type *)local_b8);
  this->m_current_term_ptr = this->m_current_term_ptr + 1;
  FunctionTableTerm::~FunctionTableTerm((FunctionTableTerm *)local_b8);
  return;
}

Assistant:

void FunctionTable::InsertTerm(const string& func_name,
                               int space_length,
                               int return_value_number,
                               const vector<SymbolType>& argument_type) {
    int argument_number = argument_type.size();
    FunctionTableTerm term(func_name, space_length, argument_number, return_value_number, argument_type);
    m_func_table.push_back(term);
    m_current_term_ptr++;
}